

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryCache.cpp
# Opt level: O3

void BinaryCache::PutLexemes(char *path,Lexeme *lexStart,uint lexCount)

{
  long lVar1;
  uint uVar2;
  void *__dest;
  long lVar3;
  
  uVar2 = NULLC::GetStringHash(path);
  lVar1 = cache;
  if (uVar2 == lastHash) {
    return;
  }
  if ((ulong)DAT_00243f64 != 0) {
    lVar3 = 0;
    do {
      if (uVar2 == *(uint *)(cache + 8 + lVar3)) {
        if (*(long *)(cache + 0x18 + lVar3) == 0) {
          __dest = operator_new__((ulong)lexCount << 5);
          *(void **)(lVar1 + 0x18 + lVar3) = __dest;
          memcpy(__dest,lexStart,(ulong)lexCount << 5);
          *(uint *)(lVar1 + 0x20 + lVar3) = lexCount;
          return;
        }
        __assert_fail("!cache[i].lexemes",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/BinaryCache.cpp"
                      ,0x88,"void BinaryCache::PutLexemes(const char *, Lexeme *, unsigned int)");
      }
      lVar3 = lVar3 + 0x28;
    } while ((ulong)DAT_00243f64 * 0x28 != lVar3);
  }
  __assert_fail("!\"module not found\"",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/BinaryCache.cpp"
                ,0x92,"void BinaryCache::PutLexemes(const char *, Lexeme *, unsigned int)");
}

Assistant:

void BinaryCache::PutLexemes(const char* path, Lexeme* lexStart, unsigned lexCount)
{
	unsigned int hash = NULLC::GetStringHash(path);

	if(hash == lastHash)
		return;

	for(unsigned i = 0; i < cache.size(); i++)
	{
		BinaryCache::CodeDescriptor &desc = cache[i];

		if(hash == cache[i].nameHash)
		{
			assert(!cache[i].lexemes);

			desc.lexemes = new Lexeme[lexCount];
			memcpy(desc.lexemes, lexStart, lexCount * sizeof(Lexeme));
			desc.lexemeCount = lexCount;

			return;
		}
	}

	assert(!"module not found");
}